

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_headers_filter_module.c
# Opt level: O0

void * ngx_http_headers_create_conf(ngx_conf_t *cf)

{
  ngx_http_headers_conf_t *conf;
  ngx_conf_t *cf_local;
  
  cf_local = (ngx_conf_t *)ngx_pcalloc(cf->pool,0x20);
  if (cf_local == (ngx_conf_t *)0x0) {
    cf_local = (ngx_conf_t *)0x0;
  }
  else {
    *(undefined4 *)&cf_local->name = 6;
  }
  return cf_local;
}

Assistant:

static void *
ngx_http_headers_create_conf(ngx_conf_t *cf)
{
    ngx_http_headers_conf_t  *conf;

    conf = ngx_pcalloc(cf->pool, sizeof(ngx_http_headers_conf_t));
    if (conf == NULL) {
        return NULL;
    }

    /*
     * set by ngx_pcalloc():
     *
     *     conf->headers = NULL;
     *     conf->expires_time = 0;
     *     conf->expires_value = NULL;
     */

    conf->expires = NGX_HTTP_EXPIRES_UNSET;

    return conf;
}